

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

void google::protobuf::compiler::php::GenerateFieldDocComment
               (Printer *printer,FieldDescriptor *field,int is_descriptor,int function_type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 is_descriptor_00;
  string local_88;
  string local_68;
  undefined1 local_48 [32];
  
  is_descriptor_00 = SUB81(&local_88,0);
  io::Printer::Print<>(printer,"/**\n");
  GenerateDocCommentBody<google::protobuf::FieldDescriptor>(printer,field);
  FieldDescriptor::DebugString_abi_cxx11_((string *)local_48,field);
  FirstLineOf(&local_68,(php *)local_48._0_8_,(string *)local_48._8_8_);
  EscapePhpdoc(&local_88,&local_68);
  io::Printer::Print<char[4],std::__cxx11::string>
            (printer," * Generated from protobuf field <code>^def^</code>\n",(char (*) [4])0x398bf6,
             &local_88);
  paVar1 = &local_88.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((php *)local_48._0_8_ != (php *)(local_48 + 0x10)) {
    operator_delete((void *)local_48._0_8_);
  }
  if (function_type == 2) {
    PhpGetterTypeName_abi_cxx11_
              (&local_88,(php *)field,(FieldDescriptor *)(ulong)(is_descriptor != 0),
               (bool)is_descriptor_00);
    io::Printer::Print<char[9],std::__cxx11::string>
              (printer," * @return ^php_type^\n",(char (*) [9])"php_type",&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  else if (function_type == 1) {
    PhpSetterTypeName_abi_cxx11_
              (&local_88,(php *)field,(FieldDescriptor *)(ulong)(is_descriptor != 0),
               (bool)is_descriptor_00);
    io::Printer::Print<char[9],std::__cxx11::string>
              (printer," * @param ^php_type^ $var\n",(char (*) [9])"php_type",&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    io::Printer::Print<>(printer," * @return $this\n");
  }
  io::Printer::Print<>(printer," */\n");
  return;
}

Assistant:

void GenerateFieldDocComment(io::Printer* printer, const FieldDescriptor* field,
                             int is_descriptor, int function_type) {
  // In theory we should have slightly different comments for setters, getters,
  // etc., but in practice everyone already knows the difference between these
  // so it's redundant information.

  // We start the comment with the main body based on the comments from the
  // .proto file (if present). We then end with the field declaration, e.g.:
  //   optional string foo = 5;
  // If the field is a group, the debug string might end with {.
  printer->Print("/**\n");
  GenerateDocCommentBody(printer, field);
  printer->Print(
    " * Generated from protobuf field <code>^def^</code>\n",
    "def", EscapePhpdoc(FirstLineOf(field->DebugString())));
  if (function_type == kFieldSetter) {
    printer->Print(" * @param ^php_type^ $var\n",
      "php_type", PhpSetterTypeName(field, is_descriptor));
    printer->Print(" * @return $this\n");
  } else if (function_type == kFieldGetter) {
    printer->Print(" * @return ^php_type^\n",
      "php_type", PhpGetterTypeName(field, is_descriptor));
  }
  printer->Print(" */\n");
}